

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MemoryManagement.h
# Opt level: O0

Object * __thiscall
chatra::Reference::
allocateWithoutLock<chatra::Object,chatra::TypeId,std::vector<std::unique_ptr<chatra::ReferenceGroup,std::default_delete<chatra::ReferenceGroup>>,std::allocator<std::unique_ptr<chatra::ReferenceGroup,std::default_delete<chatra::ReferenceGroup>>>>,std::vector<std::unique_ptr<chatra::ReferenceNode,std::default_delete<chatra::ReferenceNode>>,std::allocator<std::unique_ptr<chatra::ReferenceNode,std::default_delete<chatra::ReferenceNode>>>>,std::unordered_map<chatra::StringId,chatra::Reference,std::hash<chatra::StringId>,std::equal_to<chatra::StringId>,std::allocator<std::pair<chatra::StringId_const,chatra::Reference>>>const&>
          (Reference *this,TypeId *args,
          vector<std::unique_ptr<chatra::ReferenceGroup,_std::default_delete<chatra::ReferenceGroup>_>,_std::allocator<std::unique_ptr<chatra::ReferenceGroup,_std::default_delete<chatra::ReferenceGroup>_>_>_>
          *args_1,vector<std::unique_ptr<chatra::ReferenceNode,_std::default_delete<chatra::ReferenceNode>_>,_std::allocator<std::unique_ptr<chatra::ReferenceNode,_std::default_delete<chatra::ReferenceNode>_>_>_>
                  *args_2,
          unordered_map<chatra::StringId,_chatra::Reference,_std::hash<chatra::StringId>,_std::equal_to<chatra::StringId>,_std::allocator<std::pair<const_chatra::StringId,_chatra::Reference>_>_>
          *args_3)

{
  TypeId typeId;
  Storage *storage;
  Object *this_00;
  unordered_map<chatra::StringId,_chatra::Reference,_std::hash<chatra::StringId>,_std::equal_to<chatra::StringId>,_std::allocator<std::pair<const_chatra::StringId,_chatra::Reference>_>_>
  local_a0;
  vector<std::unique_ptr<chatra::ReferenceNode,_std::default_delete<chatra::ReferenceNode>_>,_std::allocator<std::unique_ptr<chatra::ReferenceNode,_std::default_delete<chatra::ReferenceNode>_>_>_>
  local_68;
  vector<std::unique_ptr<chatra::ReferenceGroup,_std::default_delete<chatra::ReferenceGroup>_>,_std::allocator<std::unique_ptr<chatra::ReferenceGroup,_std::default_delete<chatra::ReferenceGroup>_>_>_>
  local_50;
  Object *local_38;
  Object *object;
  unordered_map<chatra::StringId,_chatra::Reference,_std::hash<chatra::StringId>,_std::equal_to<chatra::StringId>,_std::allocator<std::pair<const_chatra::StringId,_chatra::Reference>_>_>
  *args_local_3;
  vector<std::unique_ptr<chatra::ReferenceNode,_std::default_delete<chatra::ReferenceNode>_>,_std::allocator<std::unique_ptr<chatra::ReferenceNode,_std::default_delete<chatra::ReferenceNode>_>_>_>
  *args_local_2;
  vector<std::unique_ptr<chatra::ReferenceGroup,_std::default_delete<chatra::ReferenceGroup>_>,_std::allocator<std::unique_ptr<chatra::ReferenceGroup,_std::default_delete<chatra::ReferenceGroup>_>_>_>
  *args_local_1;
  TypeId *args_local;
  Reference *this_local;
  
  object = (Object *)args_3;
  args_local_3 = (unordered_map<chatra::StringId,_chatra::Reference,_std::hash<chatra::StringId>,_std::equal_to<chatra::StringId>,_std::allocator<std::pair<const_chatra::StringId,_chatra::Reference>_>_>
                  *)args_2;
  args_local_2 = (vector<std::unique_ptr<chatra::ReferenceNode,_std::default_delete<chatra::ReferenceNode>_>,_std::allocator<std::unique_ptr<chatra::ReferenceNode,_std::default_delete<chatra::ReferenceNode>_>_>_>
                  *)args_1;
  args_local_1 = (vector<std::unique_ptr<chatra::ReferenceGroup,_std::default_delete<chatra::ReferenceGroup>_>,_std::allocator<std::unique_ptr<chatra::ReferenceGroup,_std::default_delete<chatra::ReferenceGroup>_>_>_>
                  *)args;
  args_local = (TypeId *)this;
  this_00 = (Object *)operator_new(0xa8);
  storage = this->node->group->storage;
  typeId = *(TypeId *)
            &(args_local_1->
             super__Vector_base<std::unique_ptr<chatra::ReferenceGroup,_std::default_delete<chatra::ReferenceGroup>_>,_std::allocator<std::unique_ptr<chatra::ReferenceGroup,_std::default_delete<chatra::ReferenceGroup>_>_>_>
             )._M_impl.super__Vector_impl_data._M_start;
  std::
  vector<std::unique_ptr<chatra::ReferenceGroup,_std::default_delete<chatra::ReferenceGroup>_>,_std::allocator<std::unique_ptr<chatra::ReferenceGroup,_std::default_delete<chatra::ReferenceGroup>_>_>_>
  ::vector(&local_50,
           (vector<std::unique_ptr<chatra::ReferenceGroup,_std::default_delete<chatra::ReferenceGroup>_>,_std::allocator<std::unique_ptr<chatra::ReferenceGroup,_std::default_delete<chatra::ReferenceGroup>_>_>_>
            *)args_local_2);
  std::
  vector<std::unique_ptr<chatra::ReferenceNode,_std::default_delete<chatra::ReferenceNode>_>,_std::allocator<std::unique_ptr<chatra::ReferenceNode,_std::default_delete<chatra::ReferenceNode>_>_>_>
  ::vector(&local_68,
           (vector<std::unique_ptr<chatra::ReferenceNode,_std::default_delete<chatra::ReferenceNode>_>,_std::allocator<std::unique_ptr<chatra::ReferenceNode,_std::default_delete<chatra::ReferenceNode>_>_>_>
            *)args_local_3);
  std::
  unordered_map<chatra::StringId,_chatra::Reference,_std::hash<chatra::StringId>,_std::equal_to<chatra::StringId>,_std::allocator<std::pair<const_chatra::StringId,_chatra::Reference>_>_>
  ::unordered_map(&local_a0,
                  (unordered_map<chatra::StringId,_chatra::Reference,_std::hash<chatra::StringId>,_std::equal_to<chatra::StringId>,_std::allocator<std::pair<const_chatra::StringId,_chatra::Reference>_>_>
                   *)object);
  Object::Object(this_00,storage,typeId,&local_50,&local_68,&local_a0);
  std::
  unordered_map<chatra::StringId,_chatra::Reference,_std::hash<chatra::StringId>,_std::equal_to<chatra::StringId>,_std::allocator<std::pair<const_chatra::StringId,_chatra::Reference>_>_>
  ::~unordered_map(&local_a0);
  std::
  vector<std::unique_ptr<chatra::ReferenceNode,_std::default_delete<chatra::ReferenceNode>_>,_std::allocator<std::unique_ptr<chatra::ReferenceNode,_std::default_delete<chatra::ReferenceNode>_>_>_>
  ::~vector(&local_68);
  std::
  vector<std::unique_ptr<chatra::ReferenceGroup,_std::default_delete<chatra::ReferenceGroup>_>,_std::allocator<std::unique_ptr<chatra::ReferenceGroup,_std::default_delete<chatra::ReferenceGroup>_>_>_>
  ::~vector(&local_50);
  local_38 = this_00;
  ReferenceNode::setObject(this->node,this_00);
  Storage::registerObject(this->node->group->storage,this->node->object);
  return local_38;
}

Assistant:

Type& Reference::allocateWithoutLock(Args&&... args) const {
	chatra_assert(node != nullptr);
	Type* object = new Type(node->group.storage, std::forward<Args>(args)...);
	node->setObject(object);
	node->group.storage.registerObject(node->object);
	return *object;
}